

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O0

void setupAlphaTable(void)

{
  int j_1;
  int old;
  int mul;
  int i_1;
  int j;
  int i;
  int buf;
  
  if (alphaTableInitialized == 0) {
    alphaTableInitialized = 1;
    for (i = 0x10; i < 0x20; i = i + 1) {
      for (j = 0; j < 8; j = j + 1) {
        if (j < 4) {
          alphaTable[i][j] = alphaBase[i + -0x10][3 - j % 4];
        }
        else {
          alphaTable[i][j] = -1 - alphaBase[i + -0x10][3 - j % 4];
        }
      }
    }
    for (i_1 = 0; i_1 < 0x100; i_1 = i_1 + 1) {
      for (j_1 = 0; j_1 < 8; j_1 = j_1 + 1) {
        alphaTable[i_1][j_1] = alphaTable[i_1 % 0x10 + 0x10][j_1] * (i_1 / 0x10);
      }
    }
  }
  return;
}

Assistant:

void setupAlphaTable() 
{
  if(alphaTableInitialized)
    return;
  alphaTableInitialized = 1;

	//read table used for alpha compression
	int buf;
	for(int i = 16; i<32; i++) 
	{
		for(int j=0; j<8; j++) 
		{
			buf=alphaBase[i-16][3-j%4];
			if(j<4)
				alphaTable[i][j]=buf;
			else
				alphaTable[i][j]=(-buf-1);
		}
	}
	
	//beyond the first 16 values, the rest of the table is implicit.. so calculate that!
	for(int i=0; i<256; i++) 
	{
		//fill remaining slots in table with multiples of the first ones.
		int mul = i/16;
		int old = 16+i%16;
		for(int j = 0; j<8; j++) 
		{
			alphaTable[i][j]=alphaTable[old][j]*mul;
			//note: we don't do clamping here, though we could, because we'll be clamped afterwards anyway.
		}
	}
}